

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  in_addr_t iVar1;
  char *pcVar2;
  sockaddr *psVar3;
  undefined8 uVar4;
  uint16_t uVar5;
  size_t sVar6;
  Curl_addrinfo *pCVar7;
  size_t namelen;
  size_t ss_size;
  char *curr;
  int i;
  CURLcode result;
  sockaddr_in6 *addr6;
  sockaddr_in *addr;
  Curl_addrinfo *firstai;
  Curl_addrinfo *prevai;
  Curl_addrinfo *ai;
  int port_local;
  hostent *he_local;
  
  firstai = (Curl_addrinfo *)0x0;
  addr = (sockaddr_in *)0x0;
  curr._4_4_ = 0;
  if (he == (hostent *)0x0) {
    he_local = (hostent *)0x0;
  }
  else {
    for (curr._0_4_ = 0; pcVar2 = he->h_addr_list[(int)curr], pcVar2 != (char *)0x0;
        curr._0_4_ = (int)curr + 1) {
      sVar6 = strlen(he->h_name);
      if (he->h_addrtype == 10) {
        namelen = 0x1c;
      }
      else {
        namelen = 0x10;
      }
      pCVar7 = (Curl_addrinfo *)(*Curl_ccalloc)(1,namelen + 0x30 + sVar6 + 1);
      if (pCVar7 == (Curl_addrinfo *)0x0) {
        curr._4_4_ = 0x1b;
        break;
      }
      pCVar7->ai_addr = (sockaddr *)(pCVar7 + 1);
      pCVar7->ai_canonname = pCVar7->ai_addr->sa_data + (namelen - 2);
      memcpy(pCVar7->ai_canonname,he->h_name,sVar6 + 1);
      if (addr == (sockaddr_in *)0x0) {
        addr = (sockaddr_in *)pCVar7;
      }
      if (firstai != (Curl_addrinfo *)0x0) {
        firstai->ai_next = pCVar7;
      }
      ((in_addr *)&pCVar7->ai_family)->s_addr = he->h_addrtype;
      pCVar7->ai_socktype = 1;
      pCVar7->ai_addrlen = (curl_socklen_t)namelen;
      iVar1 = ((in_addr *)&pCVar7->ai_family)->s_addr;
      if (iVar1 == 2) {
        psVar3 = pCVar7->ai_addr;
        *(undefined4 *)(psVar3->sa_data + 2) = *(undefined4 *)pcVar2;
        psVar3->sa_family = (sa_family_t)he->h_addrtype;
        uVar5 = htons((uint16_t)port);
        *(uint16_t *)psVar3->sa_data = uVar5;
      }
      else if (iVar1 == 10) {
        psVar3 = pCVar7->ai_addr;
        *(undefined8 *)(psVar3->sa_data + 6) = *(undefined8 *)pcVar2;
        uVar4 = *(undefined8 *)(pcVar2 + 8);
        psVar3[1].sa_family = (short)uVar4;
        psVar3[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
        psVar3[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
        psVar3[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
        psVar3[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
        psVar3[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
        psVar3[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
        psVar3->sa_family = (sa_family_t)he->h_addrtype;
        uVar5 = htons((uint16_t)port);
        *(uint16_t *)psVar3->sa_data = uVar5;
      }
      firstai = pCVar7;
    }
    if (curr._4_4_ != 0) {
      Curl_freeaddrinfo((Curl_addrinfo *)addr);
      addr = (sockaddr_in *)0x0;
    }
    he_local = (hostent *)addr;
  }
  return (Curl_addrinfo *)he_local;
}

Assistant:

struct Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  struct Curl_addrinfo *ai;
  struct Curl_addrinfo *prevai = NULL;
  struct Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef USE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i = 0; (curr = he->h_addr_list[i]) != NULL; i++) {
    size_t ss_size;
    size_t namelen = strlen(he->h_name) + 1; /* include null-terminator */
#ifdef USE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
    else
#endif
      ss_size = sizeof(struct sockaddr_in);

    /* allocate memory to hold the struct, the address and the name */
    ai = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    /* put the address after the struct */
    ai->ai_addr = (void *)((char *)ai + sizeof(struct Curl_addrinfo));
    /* then put the name after the address */
    ai->ai_canonname = (char *)ai->ai_addr + ss_size;
    memcpy(ai->ai_canonname, he->h_name, namelen);

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
#ifdef __MINGW32__
      addr->sin_family = (short)(he->h_addrtype);
#else
      addr->sin_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
#endif
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef USE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
#ifdef __MINGW32__
      addr6->sin6_family = (short)(he->h_addrtype);
#else
      addr6->sin6_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
#endif
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}